

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFilesGenerator::cmInstallFilesGenerator
          (cmInstallFilesGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,char *dest,bool programs,char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all,char *rename,
          bool optional)

{
  pointer pbVar1;
  size_type sVar2;
  pointer input;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message,exclude_from_all)
  ;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFilesGenerator_0071d090;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files,files);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->FilePermissions,file_permissions,&local_29);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->Rename,rename,&local_2a);
  this->Programs = programs;
  this->Optional = optional;
  sVar2 = cmGeneratorExpression::Find(&(this->super_cmInstallGenerator).Destination);
  if (sVar2 != 0xffffffffffffffff) {
    (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  }
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == false) {
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (input = (files->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; input != pbVar1; input = input + 1) {
      sVar2 = cmGeneratorExpression::Find(input);
      if (sVar2 != 0xffffffffffffffff) {
        (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
        return;
      }
    }
  }
  return;
}

Assistant:

cmInstallFilesGenerator::cmInstallFilesGenerator(
  std::vector<std::string> const& files, const char* dest, bool programs,
  const char* file_permissions, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all,
  const char* rename, bool optional)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all)
  , LocalGenerator(nullptr)
  , Files(files)
  , FilePermissions(file_permissions)
  , Rename(rename)
  , Programs(programs)
  , Optional(optional)
{
  // We need per-config actions if the destination has generator expressions.
  if (cmGeneratorExpression::Find(Destination) != std::string::npos) {
    this->ActionsPerConfig = true;
  }

  // We need per-config actions if any directories have generator expressions.
  if (!this->ActionsPerConfig) {
    for (std::string const& file : files) {
      if (cmGeneratorExpression::Find(file) != std::string::npos) {
        this->ActionsPerConfig = true;
        break;
      }
    }
  }
}